

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xtouch.c
# Opt level: O0

void touch_input_handle_begin
               (int id,double timestamp,float x,float y,_Bool primary,ALLEGRO_DISPLAY *disp)

{
  int iVar1;
  ALLEGRO_DISPLAY *in_RDX;
  byte in_SIL;
  int in_EDI;
  float in_XMM1_Da;
  float in_XMM2_Da;
  ALLEGRO_TOUCH_STATE *state;
  int index;
  ALLEGRO_DISPLAY *in_stack_00000038;
  _Bool in_stack_00000043;
  float in_stack_00000044;
  float in_stack_00000048;
  float in_stack_0000004c;
  float in_stack_00000050;
  int in_stack_00000054;
  double in_stack_00000058;
  uint in_stack_00000064;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  
  iVar1 = find_free_touch_state_index();
  if (-1 < iVar1) {
    if (touch_input_state.touches + iVar1 != (ALLEGRO_TOUCH_STATE *)0x0) {
      iVar2 = iVar1;
      _al_event_source_lock((ALLEGRO_EVENT_SOURCE *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
      touch_input_state.touches[iVar1].id = iVar2;
      touch_input_state.touches[iVar1].x = in_XMM1_Da;
      touch_input_state.touches[iVar1].y = in_XMM2_Da;
      touch_input_state.touches[iVar1].dx = 0.0;
      touch_input_state.touches[iVar1].dy = 0.0;
      touch_input_state.touches[iVar1].primary = (_Bool)(in_SIL & 1);
      touch_input_state.touches[iVar1].display = in_RDX;
      _al_event_source_unlock((ALLEGRO_EVENT_SOURCE *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      generate_touch_input_event
                (in_stack_00000064,in_stack_00000058,in_stack_00000054,in_stack_00000050,
                 in_stack_0000004c,in_stack_00000048,in_stack_00000044,in_stack_00000043,
                 in_stack_00000038);
      touch_ids[iVar2] = in_EDI;
    }
  }
  return;
}

Assistant:

static void touch_input_handle_begin(int id, double timestamp, float x, float y, bool primary, ALLEGRO_DISPLAY *disp)
{
   int index= find_free_touch_state_index();
   if (index < 0)
       return;

   ALLEGRO_TOUCH_STATE* state = touch_input_state.touches + index;
   (void)primary;

   if (NULL == state)
      return;

   _al_event_source_lock(&touch_input.es);
   state->id      = index;
   state->x       = x;
   state->y       = y;
   state->dx      = 0.0f;
   state->dy      = 0.0f;
   state->primary = primary;
   state->display = disp;
   _al_event_source_unlock(&touch_input.es);

   generate_touch_input_event(ALLEGRO_EVENT_TOUCH_BEGIN, timestamp,
      state->id, state->x, state->y, state->dx, state->dy, state->primary,
      disp);

   touch_ids[index]= id;
}